

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost.h
# Opt level: O3

double brotli::PopulationCost<704>(Histogram<704> *histogram)

{
  uint32_t *puVar1;
  bool bVar2;
  int i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  uint uVar13;
  double dVar14;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar15 [16];
  double dVar19;
  double dVar20;
  uint8_t depth_array [704];
  double local_388;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined8 local_308;
  byte local_2f8 [712];
  
  uVar5 = histogram->total_count_;
  dVar20 = 12.0;
  if (uVar5 != 0) {
    lVar3 = 0;
    iVar12 = 0;
    iVar16 = 0;
    iVar17 = 0;
    iVar18 = 0;
    do {
      puVar1 = histogram->data_ + lVar3;
      iVar12 = (iVar12 - (uint)(*puVar1 == 0)) + 1;
      iVar16 = (iVar16 - (uint)(puVar1[1] == 0)) + 1;
      iVar17 = (iVar17 - (uint)(puVar1[2] == 0)) + 1;
      iVar18 = (iVar18 - (uint)(puVar1[3] == 0)) + 1;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x2c0);
    uVar13 = iVar18 + iVar16 + iVar17 + iVar12;
    if (uVar13 != 1) {
      if (uVar13 == 2) {
        lVar3 = uVar5 + 0x14;
        auVar10._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar10._0_8_ = lVar3;
        auVar10._12_4_ = 0x45300000;
        dVar20 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
      }
      else {
        memset(local_2f8,0,0x2c0);
        if (uVar13 < 5) {
          CreateHuffmanTree(histogram->data_,0x2c0,0xf,local_2f8);
          dVar20 = 0.0;
          lVar3 = 0;
          do {
            dVar20 = dVar20 + (double)((uint)local_2f8[lVar3] * histogram->data_[lVar3]);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0x2c0);
          dVar20 = dVar20 + *(double *)(&DAT_001c8310 + (ulong)(uVar13 == 3) * 8);
        }
        else {
          local_318 = (undefined1  [16])0x0;
          local_328 = (undefined1  [16])0x0;
          local_338 = (undefined1  [16])0x0;
          local_348 = (undefined1  [16])0x0;
          local_308 = 0;
          if (uVar5 < 0x100) {
            dVar20 = (double)*(float *)(kLog2Table + uVar5 * 4);
          }
          else {
            auVar15._8_4_ = (int)(uVar5 >> 0x20);
            auVar15._0_8_ = uVar5;
            auVar15._12_4_ = 0x45300000;
            dVar20 = log2((auVar15._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
          }
          dVar19 = 0.0;
          uVar5 = 1;
          iVar12 = 0;
          uVar7 = 0;
          do {
            uVar13 = histogram->data_[uVar7];
            if ((ulong)uVar13 == 0) {
              if (uVar7 < 0x2bf) {
                uVar13 = 0x2c0 - (int)uVar7;
                lVar3 = 0;
                do {
                  if (histogram->data_[uVar7 + lVar3 + 1] != 0) {
                    uVar13 = (int)lVar3 + 1;
                    break;
                  }
                  lVar3 = lVar3 + 1;
                } while (0x2bf - uVar7 != lVar3);
                uVar7 = uVar7 + uVar13;
                if (uVar7 == 0x2c0) break;
                if (2 < uVar13) {
                  uVar13 = uVar13 - 2;
                  do {
                    iVar12 = iVar12 + 1;
                    dVar19 = dVar19 + 3.0;
                    bVar2 = 7 < uVar13;
                    uVar13 = uVar13 >> 3;
                  } while (bVar2);
                  goto LAB_001730a5;
                }
              }
              else {
                uVar7 = uVar7 + 1;
                uVar13 = 1;
                if (uVar7 == 0x2c0) break;
              }
              local_348._0_4_ = local_348._0_4_ + uVar13;
            }
            else {
              if (uVar13 < 0x100) {
                dVar9 = (double)*(float *)(kLog2Table + (ulong)uVar13 * 4);
              }
              else {
                dVar9 = log2((double)uVar13);
                uVar13 = histogram->data_[uVar7];
              }
              dVar14 = (dVar20 - dVar9) + 0.5;
              uVar4 = (ulong)dVar14;
              uVar4 = (long)(dVar14 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
              dVar19 = dVar19 + (double)uVar13 * (dVar20 - dVar9);
              if (0xe < uVar4) {
                uVar4 = 0xf;
              }
              if (uVar5 < uVar4) {
                uVar5 = uVar4;
              }
              *(int *)(local_348 + (uVar4 & 0xffffffff) * 4) =
                   *(int *)(local_348 + (uVar4 & 0xffffffff) * 4) + 1;
              uVar7 = uVar7 + 1;
            }
LAB_001730a5:
          } while (uVar7 < 0x2c0);
          local_308 = CONCAT44(iVar12,(undefined4)local_308);
          dVar9 = 0.0;
          uVar4 = 0xfffffffffffffff8;
          uVar7 = 0;
          do {
            uVar6 = (ulong)*(uint *)(local_348 + uVar4 + 8);
            if (uVar6 < 0x100) {
              dVar20 = (double)*(float *)(kLog2Table + uVar6 * 4);
              local_388 = (double)(int)*(uint *)(local_348 + uVar4 + 8);
            }
            else {
              local_388 = (double)uVar6;
              dVar20 = log2(local_388);
            }
            uVar8 = (ulong)*(uint *)(local_348 + uVar4 + 0xc);
            if (uVar8 < 0x100) {
              dVar14 = (double)*(float *)(kLog2Table + uVar8 * 4);
            }
            else {
              dVar14 = log2((double)uVar8);
            }
            uVar7 = uVar7 + uVar6 + uVar8;
            dVar9 = (dVar9 - local_388 * dVar20) - (double)uVar8 * dVar14;
            uVar4 = uVar4 + 8;
          } while (uVar4 < 0x40);
          auVar11._8_4_ = (int)(uVar7 >> 0x20);
          auVar11._0_8_ = uVar7;
          auVar11._12_4_ = 0x45300000;
          dVar20 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
          if (uVar7 != 0) {
            if (uVar7 < 0x100) {
              dVar14 = (double)*(float *)(kLog2Table + uVar7 * 4);
            }
            else {
              dVar14 = log2(dVar20);
            }
            dVar9 = dVar9 + dVar14 * dVar20;
          }
          if (dVar20 <= dVar9) {
            dVar20 = dVar9;
          }
          dVar20 = dVar19 + (double)(long)(uVar5 * 2 + 0x12) + dVar20;
        }
      }
    }
  }
  return dVar20;
}

Assistant:

double PopulationCost(const Histogram<kSize>& histogram) {
  if (histogram.total_count_ == 0) {
    return 12;
  }
  int count = 0;
  for (int i = 0; i < kSize; ++i) {
    if (histogram.data_[i] > 0) {
      ++count;
    }
  }
  if (count == 1) {
    return 12;
  }
  if (count == 2) {
    return static_cast<double>(20 + histogram.total_count_);
  }
  double bits = 0;
  uint8_t depth_array[kSize] = { 0 };
  if (count <= 4) {
    // For very low symbol count we build the Huffman tree.
    CreateHuffmanTree(&histogram.data_[0], kSize, 15, depth_array);
    for (int i = 0; i < kSize; ++i) {
      bits += histogram.data_[i] * depth_array[i];
    }
    return count == 3 ? bits + 28 : bits + 37;
  }

  // In this loop we compute the entropy of the histogram and simultaneously
  // build a simplified histogram of the code length codes where we use the
  // zero repeat code 17, but we don't use the non-zero repeat code 16.
  size_t max_depth = 1;
  uint32_t depth_histo[kCodeLengthCodes] = { 0 };
  const double log2total = FastLog2(histogram.total_count_);
  for (size_t i = 0; i < kSize;) {
    if (histogram.data_[i] > 0) {
      // Compute -log2(P(symbol)) = -log2(count(symbol)/total_count) =
      //                          =  log2(total_count) - log2(count(symbol))
      double log2p = log2total - FastLog2(histogram.data_[i]);
      // Approximate the bit depth by round(-log2(P(symbol)))
      size_t depth = static_cast<size_t>(log2p + 0.5);
      bits += histogram.data_[i] * log2p;
      if (depth > 15) {
        depth = 15;
      }
      if (depth > max_depth) {
        max_depth = depth;
      }
      ++depth_histo[depth];
      ++i;
    } else {
      // Compute the run length of zeros and add the appropriate number of 0 and
      // 17 code length codes to the code length code histogram.
      uint32_t reps = 1;
      for (size_t k = i + 1; k < kSize && histogram.data_[k] == 0; ++k) {
        ++reps;
      }
      i += reps;
      if (i == kSize) {
        // Don't add any cost for the last zero run, since these are encoded
        // only implicitly.
        break;
      }
      if (reps < 3) {
        depth_histo[0] += reps;
      } else {
        reps -= 2;
        while (reps > 0) {
          ++depth_histo[17];
          // Add the 3 extra bits for the 17 code length code.
          bits += 3;
          reps >>= 3;
        }
      }
    }
  }
  // Add the estimated encoding cost of the code length code histogram.
  bits += static_cast<double>(18 + 2 * max_depth);
  // Add the entropy of the code length code histogram.
  bits += BitsEntropy(depth_histo, kCodeLengthCodes);
  return bits;
}